

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

int htmlParseLookupSequence
              (htmlParserCtxtPtr ctxt,xmlChar first,xmlChar next,xmlChar third,int ignoreattrval)

{
  xmlChar xVar1;
  xmlParserInputPtr pxVar2;
  int iVar3;
  xmlChar *pxVar4;
  size_t sVar5;
  long lVar6;
  undefined7 in_register_00000009;
  long lVar7;
  xmlChar xVar8;
  uint uVar9;
  uint uVar10;
  
  pxVar2 = ctxt->input;
  if (pxVar2 != (xmlParserInputPtr)0x0) {
    pxVar4 = pxVar2->base;
    uVar9 = (int)pxVar2->cur - (int)pxVar4;
    if (-1 < (int)uVar9) {
      uVar10 = 0;
      if ((long)(ulong)(uVar9 & 0x7fffffff) < ctxt->checkIndex) {
        uVar10 = ctxt->hasPErefs & 1;
        uVar9 = (uint)ctxt->checkIndex;
      }
      if (pxVar2->buf == (xmlParserInputBufferPtr)0x0) {
        iVar3 = pxVar2->length;
      }
      else {
        pxVar4 = xmlBufContent(pxVar2->buf->buffer);
        sVar5 = xmlBufUse(pxVar2->buf->buffer);
        iVar3 = (int)sVar5;
      }
      iVar3 = iVar3 + -1 + (uint)(next == '\0');
      if ((int)uVar9 < iVar3) {
        lVar7 = (long)(int)uVar9;
        lVar6 = (long)iVar3;
        iVar3 = -uVar9;
        xVar8 = '\0';
        do {
          xVar1 = pxVar4[lVar7];
          if ((int)CONCAT71(in_register_00000009,third) == 0) {
LAB_0015177e:
            if ((xVar1 == first) && ((next == '\0' || (pxVar4[lVar7 + 1] == next)))) {
              ctxt->checkIndex = 0;
              return (*(int *)&pxVar2->base - *(int *)&pxVar2->cur) - iVar3;
            }
          }
          else if ((xVar1 == '\'') || (xVar1 == '\"')) {
            if (uVar10 == 0) {
              uVar10 = 1;
              xVar8 = xVar1;
            }
            else {
              if (xVar1 != xVar8) goto LAB_0015177e;
              uVar10 = 0;
            }
          }
          else {
            if (uVar10 == 0) goto LAB_0015177e;
            uVar10 = 1;
          }
          lVar7 = lVar7 + 1;
          iVar3 = iVar3 + -1;
        } while (lVar6 != lVar7);
      }
      else {
        lVar6 = (long)(int)uVar9;
      }
      ctxt->checkIndex = lVar6;
      if (uVar10 == 0) {
        uVar9 = ctxt->hasPErefs & 0xfffffffe;
      }
      else {
        uVar9 = ctxt->hasPErefs | 1;
      }
      ctxt->hasPErefs = uVar9;
    }
  }
  return -1;
}

Assistant:

static int
htmlParseLookupSequence(htmlParserCtxtPtr ctxt, xmlChar first,
                        xmlChar next, xmlChar third, int ignoreattrval)
{
    int base, len;
    htmlParserInputPtr in;
    const xmlChar *buf;
    int invalue = 0;
    char valdellim = 0x0;

    in = ctxt->input;
    if (in == NULL)
        return (-1);

    base = in->cur - in->base;
    if (base < 0)
        return (-1);

    if (ctxt->checkIndex > base) {
        base = ctxt->checkIndex;
        /* Abuse hasPErefs member to restore current state. */
        invalue = ctxt->hasPErefs & 1 ? 1 : 0;
    }

    if (in->buf == NULL) {
        buf = in->base;
        len = in->length;
    } else {
        buf = xmlBufContent(in->buf->buffer);
        len = xmlBufUse(in->buf->buffer);
    }

    /* take into account the sequence length */
    if (third)
        len -= 2;
    else if (next)
        len--;
    for (; base < len; base++) {
        if (ignoreattrval) {
            if (buf[base] == '"' || buf[base] == '\'') {
                if (invalue) {
                    if (buf[base] == valdellim) {
                        invalue = 0;
                        continue;
                    }
                } else {
                    valdellim = buf[base];
                    invalue = 1;
                    continue;
                }
            } else if (invalue) {
                continue;
            }
        }
        if (buf[base] == first) {
            if (third != 0) {
                if ((buf[base + 1] != next) || (buf[base + 2] != third))
                    continue;
            } else if (next != 0) {
                if (buf[base + 1] != next)
                    continue;
            }
            ctxt->checkIndex = 0;
#ifdef DEBUG_PUSH
            if (next == 0)
                xmlGenericError(xmlGenericErrorContext,
                                "HPP: lookup '%c' found at %d\n",
                                first, base);
            else if (third == 0)
                xmlGenericError(xmlGenericErrorContext,
                                "HPP: lookup '%c%c' found at %d\n",
                                first, next, base);
            else
                xmlGenericError(xmlGenericErrorContext,
                                "HPP: lookup '%c%c%c' found at %d\n",
                                first, next, third, base);
#endif
            return (base - (in->cur - in->base));
        }
    }
    ctxt->checkIndex = base;
    /* Abuse hasPErefs member to track current state. */
    if (invalue)
        ctxt->hasPErefs |= 1;
    else
        ctxt->hasPErefs &= ~1;
#ifdef DEBUG_PUSH
    if (next == 0)
        xmlGenericError(xmlGenericErrorContext,
                        "HPP: lookup '%c' failed\n", first);
    else if (third == 0)
        xmlGenericError(xmlGenericErrorContext,
                        "HPP: lookup '%c%c' failed\n", first, next);
    else
        xmlGenericError(xmlGenericErrorContext,
                        "HPP: lookup '%c%c%c' failed\n", first, next,
                        third);
#endif
    return (-1);
}